

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cpp
# Opt level: O1

double __thiscall wasm::WATParser::anon_unknown_21::nan(anon_unknown_21 *this,char *__tagb)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  uint extraout_XMM0_Da;
  uint extraout_XMM0_Da_00;
  undefined4 uVar3;
  uint extraout_XMM0_Da_01;
  uint extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  string_view expected;
  string_view expected_00;
  string local_68;
  Err local_48;
  
  expected._M_str = "nan:canonical";
  expected._M_len = 0xd;
  bVar2 = Lexer::takeKeyword((Lexer *)__tagb,expected);
  if (bVar2) {
    *(undefined4 *)this = 0;
    uVar3 = extraout_XMM0_Da;
    local_48.msg.field_2._M_allocated_capacity._4_4_ = extraout_XMM0_Db;
  }
  else {
    expected_00._M_str = "nan:arithmetic";
    expected_00._M_len = 0xe;
    bVar2 = Lexer::takeKeyword((Lexer *)__tagb,expected_00);
    if (!bVar2) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"expected NaN result pattern","");
      Lexer::err(&local_48,(Lexer *)__tagb,&local_68);
      *(anon_unknown_21 **)this = this + 0x10;
      paVar1 = &local_48.msg.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48.msg._M_dataplus._M_p == paVar1) {
        *(undefined4 *)(this + 0x10) = local_48.msg.field_2._M_allocated_capacity._0_4_;
        *(undefined4 *)(this + 0x14) = local_48.msg.field_2._M_allocated_capacity._4_4_;
        *(undefined4 *)(this + 0x18) = local_48.msg.field_2._8_4_;
        *(undefined4 *)(this + 0x1c) = local_48.msg.field_2._12_4_;
        uVar3 = local_48.msg.field_2._M_allocated_capacity._0_4_;
      }
      else {
        *(pointer *)this = local_48.msg._M_dataplus._M_p;
        *(ulong *)(this + 0x10) =
             CONCAT44(local_48.msg.field_2._M_allocated_capacity._4_4_,
                      local_48.msg.field_2._M_allocated_capacity._0_4_);
        uVar3 = extraout_XMM0_Da_01;
        local_48.msg.field_2._M_allocated_capacity._4_4_ = extraout_XMM0_Db_01;
      }
      *(size_type *)(this + 8) = local_48.msg._M_string_length;
      local_48.msg._M_string_length = 0;
      local_48.msg.field_2._M_allocated_capacity._0_4_ =
           local_48.msg.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      this[0x20] = (anon_unknown_21)0x1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        local_48.msg._M_dataplus._M_p = (pointer)paVar1;
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        uVar3 = extraout_XMM0_Da_02;
        local_48.msg.field_2._M_allocated_capacity._4_4_ = extraout_XMM0_Db_02;
      }
      goto LAB_00c322eb;
    }
    *(undefined4 *)this = 1;
    uVar3 = extraout_XMM0_Da_00;
    local_48.msg.field_2._M_allocated_capacity._4_4_ = extraout_XMM0_Db_00;
  }
  this[0x20] = (anon_unknown_21)0x0;
LAB_00c322eb:
  return (double)CONCAT44(local_48.msg.field_2._M_allocated_capacity._4_4_,uVar3);
}

Assistant:

Result<NaNKind> nan(Lexer& in) {
  if (in.takeKeyword("nan:canonical"sv)) {
    return NaNKind::Canonical;
  }
  if (in.takeKeyword("nan:arithmetic"sv)) {
    return NaNKind::Arithmetic;
  }
  return in.err("expected NaN result pattern");
}